

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuffer.c
# Opt level: O1

int strbuffer_init(strbuffer_t *strbuff)

{
  int iVar1;
  char *pcVar2;
  
  strbuff->size = 0x10;
  strbuff->length = 0;
  pcVar2 = (char *)jsonp_malloc(0x10);
  strbuff->value = pcVar2;
  if (pcVar2 == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    *pcVar2 = '\0';
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int strbuffer_init(strbuffer_t *strbuff)
{
    strbuff->size = STRBUFFER_MIN_SIZE;
    strbuff->length = 0;

    strbuff->value = jsonp_malloc(strbuff->size);
    if(!strbuff->value)
        return -1;

    /* initialize to empty */
    strbuff->value[0] = '\0';
    return 0;
}